

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O2

MPI_Datatype mxx::datatype_builder<std::pair<unsigned_long,_unsigned_long>_>::get_type(void)

{
  long __tmp;
  ompi_datatype_t *__tmp_1;
  long local_88;
  long local_80;
  undefined *local_78;
  undefined *local_70;
  int blocklen [2];
  pair<unsigned_long,_unsigned_long> p;
  MPI_Datatype struct_type;
  MPI_Aint t2_adr;
  MPI_Aint t1_adr;
  MPI_Aint p_adr;
  MPI_Datatype _type;
  
  blocklen[0] = 1;
  blocklen[1] = 1;
  p.first = 0;
  p.second = 0;
  MPI_Get_address(&p,&p_adr);
  MPI_Get_address(&p,&t1_adr);
  MPI_Get_address(&p.second,&t2_adr);
  local_78 = &ompi_mpi_unsigned_long;
  local_88 = t1_adr - p_adr;
  local_80 = t2_adr - p_adr;
  if (t2_adr < t1_adr) {
    local_88 = t2_adr - p_adr;
    local_80 = t1_adr - p_adr;
  }
  local_70 = &ompi_mpi_unsigned_long;
  MPI_Type_create_struct(2,blocklen,&local_88,&local_78,&struct_type);
  MPI_Type_create_resized(struct_type,0,0x10,&_type);
  MPI_Type_commit(&_type);
  MPI_Type_free(&struct_type);
  return _type;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;

        int blocklen[2] = {1, 1};
        MPI_Aint displs[2] = {0,0};
        // get actual displacement (in case of padding in the structure)
        std::pair<T1, T2> p;
        MPI_Aint p_adr, t1_adr, t2_adr;
        MPI_Get_address(&p, &p_adr);
        MPI_Get_address(&p.first, &t1_adr);
        MPI_Get_address(&p.second, &t2_adr);
        displs[0] = t1_adr - p_adr;
        displs[1] = t2_adr - p_adr;

        // create type
        // TODO: use cached type!
        MPI_Datatype types[2] = {datatype_builder<T1>::get_type(), datatype_builder<T2>::get_type()};
        // in case elements are represented the opposite way around in
        // the pair (gcc does so), then swap them
        if (displs[0] > displs[1]) {
            std::swap(displs[0], displs[1]);
            std::swap(types[0], types[1]);
        }
        // create MPI_Datatype (resized to actual sizeof())
        MPI_Datatype struct_type;
        MPI_Type_create_struct(2, blocklen, displs, types, &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(p), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);
        return _type;
    }